

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::~cmCursesMainForm(cmCursesMainForm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FORM *form;
  pointer pcVar2;
  pointer ppfVar3;
  cmCursesLongMessageForm *pcVar4;
  
  (this->super_cmCursesForm)._vptr_cmCursesForm = (_func_int **)&PTR__cmCursesMainForm_00849bf0;
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form(form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  pcVar2 = (this->OldSearchString)._M_dataplus._M_p;
  paVar1 = &(this->OldSearchString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->SearchString)._M_dataplus._M_p;
  paVar1 = &(this->SearchString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::unique_ptr<cmake,_std::default_delete<cmake>_>::~unique_ptr(&this->CMakeInstance);
  std::unique_ptr<cmCursesCacheEntryComposite,_std::default_delete<cmCursesCacheEntryComposite>_>::
  ~unique_ptr(&this->EmptyCacheEntry);
  ppfVar3 = (this->Fields).super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppfVar3 != (pointer)0x0) {
    operator_delete(ppfVar3,(long)(this->Fields).
                                  super__Vector_base<fieldnode_*,_std::allocator<fieldnode_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppfVar3)
    ;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->HelpMessage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Args);
  pcVar2 = (this->LastProgress)._M_dataplus._M_p;
  paVar1 = &(this->LastProgress).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->Outputs);
  pcVar4 = (this->LogForm)._M_t.
           super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>
           .super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl;
  if (pcVar4 != (cmCursesLongMessageForm *)0x0) {
    (**(code **)((long)(pcVar4->super_cmCursesForm)._vptr_cmCursesForm + 8))();
  }
  (this->LogForm)._M_t.
  super___uniq_ptr_impl<cmCursesLongMessageForm,_std::default_delete<cmCursesLongMessageForm>_>._M_t
  .super__Tuple_impl<0UL,_cmCursesLongMessageForm_*,_std::default_delete<cmCursesLongMessageForm>_>.
  super__Head_base<0UL,_cmCursesLongMessageForm_*,_false>._M_head_impl =
       (cmCursesLongMessageForm *)0x0;
  std::vector<cmCursesCacheEntryComposite,_std::allocator<cmCursesCacheEntryComposite>_>::~vector
            (&this->Entries);
  cmCursesForm::~cmCursesForm(&this->super_cmCursesForm);
  return;
}

Assistant:

cmCursesMainForm::~cmCursesMainForm()
{
  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }
}